

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O3

void __thiscall cali::Caliper::async_event(Caliper *this,SnapshotView info)

{
  siglock *psVar1;
  ThreadData *pTVar2;
  pointer pCVar3;
  ChannelBody *__args_1;
  pointer pfVar4;
  pointer pCVar5;
  function<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView)> *f;
  pointer this_00;
  Channel *channel;
  
  pTVar2 = this->sT;
  psVar1 = &pTVar2->lock;
  psVar1->m_lock = psVar1->m_lock + 1;
  pCVar3 = (this->sG->active_channels).
           super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar5 = (this->sG->active_channels).
                super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar5 != pCVar3; pCVar5 = pCVar5 + 1) {
    __args_1 = (pCVar5->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    pfVar4 = (__args_1->events).async_event.mCb.
             super__Vector_base<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (__args_1->events).async_event.mCb.
                   super__Vector_base<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView)>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pfVar4;
        this_00 = this_00 + 1) {
      std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView)>::operator()
                (this_00,this,__args_1,info);
    }
  }
  psVar1 = &pTVar2->lock;
  psVar1->m_lock = psVar1->m_lock + -1;
  return;
}

Assistant:

void Caliper::async_event(SnapshotView info)
{
    std::lock_guard<::siglock> g(sT->lock);

    for (auto& channel : sG->active_channels)
        channel.mP->events.async_event(this, channel.body(), info);
}